

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdialog.cpp
# Opt level: O2

void __thiscall QFontDialogPrivate::initHelper(QFontDialogPrivate *this,QPlatformDialogHelper *h)

{
  undefined8 uVar1;
  ConnectionType type;
  long in_FS_OFFSET;
  Object local_48 [8];
  Object local_40 [8];
  code *local_38;
  undefined8 local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = *(undefined8 *)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  QPlatformFontDialogHelper::setOptions((QSharedPointer *)h);
  QFontDialog::currentFont((QFontDialog *)&local_38);
  (**(code **)(*(long *)h + 0x80))(h,(QFont *)&local_38);
  QFont::~QFont((QFont *)&local_38);
  local_38 = QFontDialog::currentFontChanged;
  local_30 = 0;
  type = (ConnectionType)uVar1;
  QObject::
  connect<void(QPlatformFontDialogHelper::*)(QFont_const&),void(QFontDialog::*)(QFont_const&)>
            (local_40,(offset_in_QPlatformFontDialogHelper_to_subr)h,
             (ContextType *)QPlatformFontDialogHelper::currentFontChanged,
             (offset_in_QFontDialog_to_subr *)0x0,type);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  local_38 = QFontDialog::fontSelected;
  local_30 = 0;
  QObject::
  connect<void(QPlatformFontDialogHelper::*)(QFont_const&),void(QFontDialog::*)(QFont_const&)>
            (local_48,(offset_in_QPlatformFontDialogHelper_to_subr)h,
             (ContextType *)QPlatformFontDialogHelper::fontSelected,
             (offset_in_QFontDialog_to_subr *)0x0,type);
  QMetaObject::Connection::~Connection((Connection *)local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFontDialogPrivate::initHelper(QPlatformDialogHelper *h)
{
    Q_Q(QFontDialog);
    auto *fontDialogHelper = static_cast<QPlatformFontDialogHelper *>(h);
    fontDialogHelper->setOptions(options);
    fontDialogHelper->setCurrentFont(q->currentFont());
    QObject::connect(fontDialogHelper, &QPlatformFontDialogHelper::currentFontChanged,
                     q, &QFontDialog::currentFontChanged);
    QObject::connect(fontDialogHelper, &QPlatformFontDialogHelper::fontSelected,
                     q, &QFontDialog::fontSelected);
}